

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InstructionTreeVm.cpp
# Opt level: O0

VmValue * CompileVmGenericClassPrototype
                    (ExpressionContext *ctx,VmModule *module,ExprGenericClassPrototype *node)

{
  VmValue *pVVar1;
  ExprGenericClassPrototype *node_local;
  VmModule *module_local;
  ExpressionContext *ctx_local;
  
  pVVar1 = anon_unknown.dwarf_c91b1::CreateVoid(module);
  pVVar1 = anon_unknown.dwarf_c91b1::CheckType(ctx,&node->super_ExprBase,pVVar1);
  return pVVar1;
}

Assistant:

VmValue* CompileVmGenericClassPrototype(ExpressionContext &ctx, VmModule *module, ExprGenericClassPrototype *node)
{
	return CheckType(ctx, node, CreateVoid(module));
}